

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawCapsule
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar halfHeight,int upAxis,
          cbtTransform *transform,cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cbtScalar cVar5;
  cbtScalar cVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM16 [16];
  cbtVector3 center;
  cbtVector3 axis;
  cbtVector3 up;
  cbtScalar local_d8;
  float fStack_d4;
  undefined8 uStack_d0;
  cbtScalar local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  cbtScalar local_b8;
  cbtScalar local_b4;
  cbtScalar local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  lVar10 = (long)upAxis;
  _local_d8 = 0;
  uStack_d0 = 0;
  _local_c8 = 0;
  uStack_c0 = 0;
  (&local_d8)[lVar10] = halfHeight;
  (&local_c8)[lVar10] = -halfHeight;
  local_98._0_8_ = *(undefined8 *)(transform->m_basis).m_el[0].m_floats;
  local_98._8_8_ = *(undefined8 *)((transform->m_basis).m_el[0].m_floats + 2);
  local_88 = *(undefined8 *)(transform->m_basis).m_el[1].m_floats;
  uStack_80 = *(undefined8 *)((transform->m_basis).m_el[1].m_floats + 2);
  local_78 = *(undefined8 *)(transform->m_basis).m_el[2].m_floats;
  uStack_70 = *(undefined8 *)((transform->m_basis).m_el[2].m_floats + 2);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c4 * (transform->m_basis).m_el[0].m_floats[1])),
                           ZEXT416((uint)local_c8),
                           ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c4 * (transform->m_basis).m_el[1].m_floats[1])),
                           ZEXT416((uint)local_c8),
                           ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c4 * (transform->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)local_c8),
                            ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)uStack_c0),
                           ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)uStack_c0),
                           ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)uStack_c0),
                            ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]));
  auVar3 = vinsertps_avx(ZEXT416((uint)(auVar3._0_4_ + (transform->m_origin).m_floats[0])),
                         ZEXT416((uint)(auVar4._0_4_ + (transform->m_origin).m_floats[1])),0x10);
  local_68 = vinsertps_avx(auVar3,ZEXT416((uint)(auVar13._0_4_ + (transform->m_origin).m_floats[2]))
                           ,0x28);
  auVar4 = local_68;
  local_a8._0_8_ = local_68._0_8_;
  local_a8._8_8_ = local_68._8_8_;
  lVar8 = (long)(upAxis + 1 + ((upAxis + 1) / 3) * -3);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(local_98 + lVar8 * 4)),
                         ZEXT416(*(uint *)((long)&local_88 + lVar8 * 4)),0x10);
  local_40 = vmovlhps_avx(auVar3,ZEXT416(*(uint *)((long)&local_78 + lVar8 * 4)));
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(local_98 + lVar10 * 4)),
                         ZEXT416(*(uint *)((long)&local_88 + lVar10 * 4)),0x10);
  auVar12._0_4_ = *(uint *)((long)&local_78 + lVar10 * 4) ^ 0x80000000;
  auVar12._4_4_ = 0x80000000;
  auVar12._8_4_ = 0x80000000;
  auVar12._12_4_ = 0x80000000;
  auVar13._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
  auVar13._8_4_ = auVar3._8_4_ ^ 0x80000000;
  auVar13._12_4_ = auVar3._12_4_ ^ 0x80000000;
  local_50 = vinsertps_avx(auVar13,auVar12,0x28);
  local_68 = auVar4;
  (*this->_vptr_cbtIDebugDraw[0x12])(this,local_a8,local_40,local_50,color,0);
  local_98 = *(undefined1 (*) [16])(transform->m_basis).m_el[0].m_floats;
  local_88 = *(undefined8 *)(transform->m_basis).m_el[1].m_floats;
  uStack_80 = *(undefined8 *)((transform->m_basis).m_el[1].m_floats + 2);
  local_78 = *(undefined8 *)(transform->m_basis).m_el[2].m_floats;
  uStack_70 = *(undefined8 *)((transform->m_basis).m_el[2].m_floats + 2);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fStack_d4 * (transform->m_basis).m_el[0].m_floats[1])),
                           ZEXT416((uint)local_d8),
                           ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_d4 * (transform->m_basis).m_el[1].m_floats[1])),
                           ZEXT416((uint)local_d8),
                           ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fStack_d4 * (transform->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)local_d8),
                            ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)uStack_d0),
                           ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)uStack_d0),
                           ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)uStack_d0),
                            ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]));
  auVar3 = vinsertps_avx(ZEXT416((uint)(auVar3._0_4_ + (transform->m_origin).m_floats[0])),
                         ZEXT416((uint)(auVar4._0_4_ + (transform->m_origin).m_floats[1])),0x10);
  local_a8 = vinsertps_avx(auVar3,ZEXT416((uint)(auVar13._0_4_ + (transform->m_origin).m_floats[2]))
                           ,0x28);
  local_68 = local_a8;
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(local_98 + lVar8 * 4)),
                         ZEXT416(*(uint *)((long)&local_88 + lVar8 * 4)),0x10);
  local_40 = vmovlhps_avx(auVar3,ZEXT416(*(uint *)((long)&local_78 + lVar8 * 4)));
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(local_98 + lVar10 * 4)),
                         ZEXT416(*(uint *)((long)&local_88 + lVar10 * 4)),0x10);
  local_50 = vmovlhps_avx(auVar3,ZEXT416(*(uint *)((long)&local_78 + lVar10 * 4)));
  (*this->_vptr_cbtIDebugDraw[0x12])
            ((ulong)(uint)radius,SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0x41f00000),0),this,local_a8,local_40,local_50,color,0);
  local_b0 = (transform->m_origin).m_floats[0];
  local_b4 = (transform->m_origin).m_floats[1];
  local_b8 = (transform->m_origin).m_floats[2];
  uVar9 = 0xffffffe2;
  iVar7 = upAxis + 2 + ((upAxis + 2) / 3) * -3;
  do {
    uVar9 = uVar9 + 0x1e;
    auVar3 = vcvtsi2ss_avx512f(in_XMM16,uVar9);
    local_ac = auVar3._0_4_ * 0.017453292;
    fVar11 = sinf(local_ac);
    (&local_c8)[lVar8] = fVar11 * radius;
    (&local_d8)[lVar8] = fVar11 * radius;
    fVar11 = cosf(local_ac);
    cVar6 = local_b0;
    cVar5 = local_b4;
    (&local_c8)[iVar7] = fVar11 * radius;
    (&local_d8)[iVar7] = fVar11 * radius;
    fVar11 = (transform->m_basis).m_el[1].m_floats[1];
    fVar1 = (transform->m_basis).m_el[0].m_floats[1];
    fVar2 = (transform->m_basis).m_el[2].m_floats[1];
    auVar15 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fStack_c4)),auVar15,ZEXT416((uint)local_c8));
    auVar12 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_c4)),auVar12,ZEXT416((uint)local_c8));
    auVar17 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fStack_c4)),auVar17,ZEXT416((uint)local_c8));
    auVar16 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
    auVar3 = vfmadd231ss_fma(auVar3,auVar16,ZEXT416((uint)uStack_c0));
    auVar14 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
    auVar4 = vfmadd231ss_fma(auVar4,auVar14,ZEXT416((uint)uStack_c0));
    auVar18 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
    auVar13 = vfmadd231ss_fma(auVar13,auVar18,ZEXT416((uint)uStack_c0));
    auVar3 = vinsertps_avx(ZEXT416((uint)(cVar6 + auVar4._0_4_)),
                           ZEXT416((uint)(cVar5 + auVar3._0_4_)),0x10);
    local_98 = vinsertps_avx(auVar3,ZEXT416((uint)(local_b8 + auVar13._0_4_)),0x28);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_d4)),ZEXT416((uint)local_d8),auVar12);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fStack_d4)),ZEXT416((uint)local_d8),auVar15);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fStack_d4)),auVar17,ZEXT416((uint)local_d8));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)uStack_d0),auVar14);
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)uStack_d0),auVar16);
    auVar13 = vfmadd231ss_fma(auVar13,auVar18,ZEXT416((uint)uStack_d0));
    auVar3 = vinsertps_avx(ZEXT416((uint)(cVar6 + auVar3._0_4_)),
                           ZEXT416((uint)(cVar5 + auVar4._0_4_)),0x10);
    local_a8 = vinsertps_avx(auVar3,ZEXT416((uint)(local_b8 + auVar13._0_4_)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_98,local_a8,color);
  } while (uVar9 < 0x14a);
  return;
}

Assistant:

virtual void drawCapsule(cbtScalar radius, cbtScalar halfHeight, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		int stepDegrees = 30;

		cbtVector3 capStart(0.f, 0.f, 0.f);
		capStart[upAxis] = -halfHeight;

		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = halfHeight;

		// Draw the ends
		{
			cbtTransform childTransform = transform;
			childTransform.getOrigin() = transform * capStart;
			{
				cbtVector3 center = childTransform.getOrigin();
				cbtVector3 up = childTransform.getBasis().getColumn((upAxis + 1) % 3);
				cbtVector3 axis = -childTransform.getBasis().getColumn(upAxis);
				cbtScalar minTh = -SIMD_HALF_PI;
				cbtScalar maxTh = SIMD_HALF_PI;
				cbtScalar minPs = -SIMD_HALF_PI;
				cbtScalar maxPs = SIMD_HALF_PI;

				drawSpherePatch(center, up, axis, radius, minTh, maxTh, minPs, maxPs, color, cbtScalar(stepDegrees), false);
			}
		}

		{
			cbtTransform childTransform = transform;
			childTransform.getOrigin() = transform * capEnd;
			{
				cbtVector3 center = childTransform.getOrigin();
				cbtVector3 up = childTransform.getBasis().getColumn((upAxis + 1) % 3);
				cbtVector3 axis = childTransform.getBasis().getColumn(upAxis);
				cbtScalar minTh = -SIMD_HALF_PI;
				cbtScalar maxTh = SIMD_HALF_PI;
				cbtScalar minPs = -SIMD_HALF_PI;
				cbtScalar maxPs = SIMD_HALF_PI;
				drawSpherePatch(center, up, axis, radius, minTh, maxTh, minPs, maxPs, color, cbtScalar(stepDegrees), false);
			}
		}

		// Draw some additional lines
		cbtVector3 start = transform.getOrigin();

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = capStart[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = capStart[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * capStart, start + transform.getBasis() * capEnd, color);
		}
	}